

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

int Aig_ManPartitionedSat
              (Aig_Man_t *p,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  byte *pbVar1;
  Aig_Man_t *pAVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *vNode2Part;
  Vec_Ptr_t *pVVar7;
  Aig_Man_t *pAVar8;
  sat_solver *s;
  int *__s;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  void **ppvVar15;
  long lVar16;
  ulong uVar17;
  timespec ts;
  Vec_Vec_t *vPart2Pos;
  Vec_Vec_t *vPio2Id;
  timespec local_a0;
  Vec_Ptr_t *local_90;
  uint local_84;
  uint local_80;
  int local_7c;
  Vec_Int_t *local_78;
  int local_6c;
  int *local_68;
  ulong local_60;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  Vec_Ptr_t *local_40;
  void **local_38;
  
  local_84 = nConfTotal;
  local_7c = fAlignPol;
  iVar5 = clock_gettime(3,&local_a0);
  if (iVar5 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
  }
  switch(nAlgo) {
  case 0:
    vNode2Part = Aig_ManPartitionMonolithic(p);
    break;
  case 1:
    vNode2Part = Aig_ManPartitionLevelized(p,nPartSize);
    break;
  case 2:
    iVar5 = 0;
    goto LAB_00640414;
  case 3:
    iVar5 = 1;
LAB_00640414:
    vNode2Part = Aig_ManPartitionDfs(p,nPartSize,iVar5);
    break;
  default:
    puts("Unknown partitioning algorithm.");
    return -1;
  }
  if (fVerbose != 0) {
    uVar12 = vNode2Part->nSize;
    if ((ulong)uVar12 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *vNode2Part->pArray;
      if (1 < (int)uVar12) {
        uVar10 = 1;
        do {
          iVar14 = vNode2Part->pArray[uVar10];
          if (iVar5 <= iVar14) {
            iVar5 = iVar14;
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
    }
    iVar14 = 0x9738f8;
    printf("Partitioning derived %d partitions. ",(ulong)(iVar5 + 1));
    Abc_Print(iVar14,"%s =","Time");
    iVar14 = 3;
    iVar5 = clock_gettime(3,&local_a0);
    if (iVar5 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 - lVar16) / 1000000.0);
  }
  pVVar7 = Aig_ManPartSplit(p,vNode2Part,&local_50,&local_58);
  if (vNode2Part->pArray != (int *)0x0) {
    free(vNode2Part->pArray);
  }
  free(vNode2Part);
  if (fVerbose != 0) {
    iVar5 = 0x97391d;
    printf("Partions were transformed into AIGs. ");
    Abc_Print(iVar5,"%s =","Time");
    iVar14 = 3;
    iVar5 = clock_gettime(3,&local_a0);
    if (iVar5 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 - lVar16) / 1000000.0);
  }
  local_90 = pVVar7;
  if ((fSynthesize != 0) && (iVar5 = pVVar7->nSize, 0 < (long)iVar5)) {
    ppvVar15 = pVVar7->pArray;
    lVar16 = 0;
    do {
      pAVar2 = (Aig_Man_t *)ppvVar15[lVar16];
      pAVar8 = Dar_ManRwsat(pAVar2,0,0);
      ppvVar15[lVar16] = pAVar8;
      Aig_ManStop(pAVar2);
      lVar16 = lVar16 + 1;
    } while (iVar5 != lVar16);
  }
  s = sat_solver_new();
  iVar5 = p->vObjs->nSize;
  local_78 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar14 = iVar5;
  }
  local_78->nCap = iVar14;
  if (iVar14 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar14 << 2);
  }
  pVVar7 = local_90;
  local_78->pArray = __s;
  local_78->nSize = iVar5;
  memset(__s,0,(long)iVar5 << 2);
  local_60 = (ulong)pVVar7->nSize;
  if ((long)local_60 < 1) {
    sat_solver_delete(s);
    iVar5 = -1;
LAB_00640963:
    ppvVar15 = pVVar7->pArray;
    if (ppvVar15 == (void **)0x0) goto LAB_00640975;
  }
  else {
    local_38 = pVVar7->pArray;
    uVar10 = 0;
    local_80 = 0;
    local_48 = local_50;
    local_40 = local_58;
    uVar12 = local_84;
    local_68 = __s;
    do {
      pVVar7 = local_48;
      pAVar2 = (Aig_Man_t *)local_38[uVar10];
      iVar5 = clock_gettime(3,&local_a0);
      if (iVar5 < 0) {
        lVar16 = 1;
      }
      else {
        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
        lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_a0.tv_sec * -1000000;
      }
      if (local_7c == 0) {
        pVVar9 = pAVar2->vObjs;
        if (0 < pVVar9->nSize) {
          lVar11 = 0;
          do {
            if (pVVar9->pArray[lVar11] != (void *)0x0) {
              pbVar1 = (byte *)((long)pVVar9->pArray[lVar11] + 0x18);
              *pbVar1 = *pbVar1 & 0xf7;
              pVVar9 = pAVar2->vObjs;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar9->nSize);
        }
      }
      else {
        if ((long)pVVar7->nSize <= (long)uVar10) goto LAB_00640a58;
        Aig_ManPartSetNodePolarity(p,pAVar2,(Vec_Int_t *)pVVar7->pArray[uVar10]);
      }
      if ((long)pVVar7->nSize <= (long)uVar10) {
LAB_00640a58:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      if ((long)local_40->nSize <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      Aig_ManAddNewCnfToSolver
                (s,pAVar2,local_78,(Vec_Int_t *)pVVar7->pArray[uVar10],
                 (Vec_Ptr_t *)local_40->pArray[uVar10],local_7c);
      iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)(int)uVar12,0,0,0);
      if (fVerbose != 0) {
        uVar13 = local_80 + pAVar2->nObjs[5] + pAVar2->nObjs[6];
        local_6c = iVar5;
        uVar6 = sat_solver_nvars(s);
        iVar5 = 0x973943;
        local_80 = uVar13;
        printf("%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",uVar10 & 0xffffffff,
               (ulong)uVar13,(ulong)uVar6,(ulong)(s->stats).clauses,(ulong)(s->stats).learnts);
        Abc_Print(iVar5,"%s =","Time");
        iVar14 = 3;
        iVar5 = clock_gettime(3,&local_a0);
        if (iVar5 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar11 + lVar16) / 1000000.0);
        iVar5 = local_6c;
      }
      bVar4 = true;
      if (iVar5 != 1) {
        if (iVar5 == -1) {
          iVar5 = 1;
          goto LAB_00640928;
        }
        bVar4 = false;
      }
      uVar12 = uVar12 - (int)(s->stats).conflicts;
      if ((int)uVar12 < 1) {
        printf("Exceeded the limit on the total number of conflicts (%d).\n",(ulong)local_84);
        break;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_60);
    iVar5 = -1;
    if (bVar4) {
      Aig_ManDeriveCounterExample(p,local_78,s);
      iVar5 = 0;
    }
LAB_00640928:
    sat_solver_delete(s);
    uVar10 = local_60;
    __s = local_68;
    pVVar7 = local_90;
    if ((int)local_60 < 1) goto LAB_00640963;
    ppvVar15 = local_90->pArray;
    uVar17 = 0;
    do {
      Aig_ManStop((Aig_Man_t *)ppvVar15[uVar17]);
      uVar17 = uVar17 + 1;
    } while (uVar10 != uVar17);
  }
  free(ppvVar15);
LAB_00640975:
  free(pVVar7);
  iVar14 = local_50->nSize;
  if (0 < iVar14) {
    lVar16 = 0;
    do {
      pvVar3 = local_50->pArray[lVar16];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar14 = local_50->nSize;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar14);
  }
  if (local_50->pArray != (void **)0x0) {
    free(local_50->pArray);
  }
  free(local_50);
  iVar14 = local_58->nSize;
  if (0 < iVar14) {
    lVar16 = 0;
    do {
      pvVar3 = local_58->pArray[lVar16];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar14 = local_58->nSize;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar14);
  }
  if (local_58->pArray != (void **)0x0) {
    free(local_58->pArray);
  }
  free(local_58);
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(local_78);
  return iVar5;
}

Assistant:

int Aig_ManPartitionedSat( Aig_Man_t * p, int nAlgo, int nPartSize, 
    int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    sat_solver * pSat;
    Vec_Ptr_t * vAigs;
    Vec_Vec_t * vPio2Id, * vPart2Pos;
    Aig_Man_t * pAig, * pTemp;
    Vec_Int_t * vNode2Part, * vNode2Var;
    int nConfRemaining = nConfTotal, nNodes = 0;
    int i, status, RetValue = -1;
    abctime clk;

    // perform partitioning according to the selected algorithm
    clk = Abc_Clock();
    switch ( nAlgo )
    {
    case 0: 
        vNode2Part = Aig_ManPartitionMonolithic( p );
        break;
    case 1: 
        vNode2Part = Aig_ManPartitionLevelized( p, nPartSize );
        break;
    case 2: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 0 );
        break;
    case 3: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 1 );
        break;
    default:
        printf( "Unknown partitioning algorithm.\n" );
        return -1;
    }

    if ( fVerbose )
    {
    printf( "Partitioning derived %d partitions. ", Vec_IntFindMax(vNode2Part) + 1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // split the original AIG into partition AIGs (vAigs)
    // also, derives mapping of PIs/POs of partition AIGs into original nodes
    // also, derives mapping of POs of the original AIG into partitions
    vAigs = Aig_ManPartSplit( p, vNode2Part, (Vec_Ptr_t **)&vPio2Id, (Vec_Ptr_t **)&vPart2Pos );
    Vec_IntFree( vNode2Part );

    if ( fVerbose )
    {
    printf( "Partions were transformed into AIGs. " );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // synthesize partitions
    if ( fSynthesize )
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
        pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 );
        Vec_PtrWriteEntry( vAigs, i, pAig );
        Aig_ManStop( pTemp );
    }

    // start the SAT solver
    pSat = sat_solver_new();
//    pSat->verbosity = fVerbose;
    // start mapping of the original AIG IDs into their SAT variable numbers
    vNode2Var = Vec_IntStart( Aig_ManObjNumMax(p) );

    // add partitions, one at a time, and run the SAT solver 
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
clk = Abc_Clock();
        // transform polarity of the AIG
        if ( fAlignPol )
            Aig_ManPartSetNodePolarity( p, pAig, Vec_VecEntryInt(vPio2Id,i) );
        else
            Aig_ManPartResetNodePolarity( pAig );
        // add CNF of this partition to the SAT solver
        if ( Aig_ManAddNewCnfToSolver( pSat, pAig, vNode2Var, 
            Vec_VecEntryInt(vPio2Id,i), Vec_VecEntry(vPart2Pos,i), fAlignPol ) )
        {
            RetValue = 1;
            break;
        }
        // call the SAT solver
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfRemaining, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",
                i, nNodes += Aig_ManNodeNum(pAig), sat_solver_nvars(pSat), 
                (int)pSat->stats.clauses, (int)pSat->stats.learnts );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
        // analize the result
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        else if ( status == l_True )
            RetValue = 0;
        else
            RetValue = -1;
        nConfRemaining -= pSat->stats.conflicts;
        if ( nConfRemaining <= 0 )
        {
            printf( "Exceeded the limit on the total number of conflicts (%d).\n", nConfTotal );
            break;
        }
    }
    if ( RetValue == 0 )
        Aig_ManDeriveCounterExample( p, vNode2Var, pSat );
    // cleanup
    sat_solver_delete( pSat );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
    Vec_VecFree( vPio2Id );
    Vec_VecFree( vPart2Pos );
    Vec_IntFree( vNode2Var );
    return RetValue;
}